

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_combo_begin_symbol_text
              (nk_context *ctx,char *selected,int len,nk_symbol_type symbol,nk_vec2 size)

{
  nk_command_buffer *out;
  nk_vec2 nVar1;
  nk_window *win;
  uint is_clicked;
  nk_rect r;
  nk_rect rect;
  nk_rect header_00;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  nk_widget_layout_states nVar6;
  int iVar7;
  nk_color foreground;
  long lVar8;
  nk_context *i;
  nk_style_combo *pnVar9;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar10;
  float fVar11;
  nk_rect r_00;
  nk_rect rect_00;
  nk_rect content;
  nk_rect b;
  nk_rect header;
  nk_text text;
  nk_rect button;
  nk_rect local_d8;
  undefined1 local_c8 [16];
  nk_symbol_type local_ac;
  ulong local_a8;
  undefined8 uStack_a0;
  nk_text local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  nk_rect local_50;
  nk_rect local_40;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5a24,
                  "int nk_combo_begin_symbol_text(struct nk_context *, const char *, int, enum nk_symbol_type, struct nk_vec2)"
                 );
  }
  win = ctx->current;
  if (win != (nk_window *)0x0) {
    local_68._8_4_ = in_XMM0_Dc;
    local_68._0_8_ = size;
    local_68._12_4_ = in_XMM0_Dd;
    if (win->layout != (nk_panel *)0x0) {
      nVar6 = nk_widget(&local_d8,ctx);
      if (nVar6 == NK_WIDGET_INVALID) {
        iVar7 = 0;
      }
      else {
        i = ctx;
        if ((win->layout->flags & 0x1000) != 0) {
          i = (nk_context *)0x0;
        }
        if (nVar6 == NK_WIDGET_ROM) {
          i = (nk_context *)0x0;
        }
        local_c8._4_4_ = local_d8.y;
        local_c8._0_4_ = local_d8.x;
        local_a8 = CONCAT44(local_d8.h,local_d8.w);
        r.y = local_d8.y;
        r.x = local_d8.x;
        r.w = local_d8.w;
        r.h = local_d8.h;
        local_c8._8_8_ = 0;
        uStack_a0 = 0;
        local_ac = symbol;
        iVar7 = nk_button_behavior(&ctx->last_widget_state,r,&i->input,NK_BUTTON_DEFAULT);
        uVar4 = local_a8;
        auVar3 = local_c8;
        if ((ctx->last_widget_state & 0x20) == 0) {
          if ((ctx->last_widget_state & 0x10) == 0) {
            pnVar9 = &(ctx->style).combo;
            local_98.text = (ctx->style).combo.label_normal;
            foreground = (ctx->style).combo.symbol_normal;
          }
          else {
            pnVar9 = (nk_style_combo *)&(ctx->style).combo.hover;
            local_98.text = (ctx->style).combo.label_hover;
            foreground = (ctx->style).combo.symbol_hover;
          }
        }
        else {
          pnVar9 = (nk_style_combo *)&(ctx->style).combo.active;
          local_98.text = (ctx->style).combo.label_active;
          foreground = (ctx->style).combo.symbol_active;
        }
        uVar2 = local_c8._0_8_;
        is_clicked = CONCAT31(0,iVar7 != 0);
        if ((pnVar9->normal).type == NK_STYLE_ITEM_IMAGE) {
          local_98.background.r = '\0';
          local_98.background.g = '\0';
          local_98.background.b = '\0';
          local_98.background.a = '\0';
          r_00.w = (float)local_a8._0_4_;
          r_00.h = (float)local_a8._4_4_;
          r_00.x = (float)local_c8._0_4_;
          r_00.y = (float)local_c8._4_4_;
          local_c8 = auVar3;
          nk_draw_image(&win->buffer,r_00,&(pnVar9->normal).data.image,(nk_color)0xffffffff);
          local_a8 = local_a8 & 0xffffffff00000000;
        }
        else {
          local_98.background = (pnVar9->normal).data.color;
          local_c8._0_4_ = is_clicked;
          auVar3 = local_c8;
          local_a8 = CONCAT44(local_a8._4_4_,local_98.background);
          uVar5 = local_a8;
          local_a8._0_4_ = SUB84(uVar4,0);
          local_a8._4_4_ = SUB84(uVar4,4);
          rect_00.w = (float)local_a8._0_4_;
          rect_00.h = (float)local_a8._4_4_;
          local_c8._0_4_ = (undefined4)uVar2;
          local_c8._4_4_ = SUB84(uVar2,4);
          rect_00.x = (float)local_c8._0_4_;
          rect_00.y = (float)local_c8._4_4_;
          local_c8 = auVar3;
          local_a8 = uVar5;
          nk_fill_rect(&win->buffer,rect_00,(ctx->style).combo.rounding,local_98.background);
          rect.y = local_d8.y;
          rect.x = local_d8.x;
          rect.w = local_d8.w;
          rect.h = local_d8.h;
          is_clicked = local_c8._0_4_;
          nk_stroke_rect(&win->buffer,rect,(ctx->style).combo.rounding,(ctx->style).combo.border,
                         (ctx->style).combo.border_color);
        }
        lVar8 = 0x1be4;
        if ((ctx->last_widget_state & 0x10) == 0) {
          lVar8 = (ulong)(iVar7 != 0) * 8 + 0x1be0;
        }
        local_40.y = (ctx->style).combo.button_padding.y;
        local_40.w = local_d8.h - (local_40.y + local_40.y);
        local_40.x = ((local_d8.x + local_d8.w) - local_d8.h) - (ctx->style).combo.button_padding.x;
        local_c8 = ZEXT416((uint)local_40.x);
        local_40.y = local_40.y + local_d8.y;
        nVar1 = (ctx->style).combo.button.padding;
        fVar10 = nVar1.x;
        local_50.x = local_40.x + fVar10;
        fVar11 = nVar1.y;
        local_50.y = local_40.y + fVar11;
        local_50.w = local_40.w - (fVar10 + fVar10);
        local_50.h = local_40.w - (fVar11 + fVar11);
        out = &win->buffer;
        local_40.h = local_40.w;
        nk_draw_button_symbol
                  (out,&local_40,&local_50,ctx->last_widget_state,&(ctx->style).combo.button,
                   *(nk_symbol_type *)((long)&(ctx->input).keyboard.keys[0].down + lVar8),
                   (ctx->style).font);
        nVar1 = (ctx->style).combo.content_padding;
        fVar10 = local_d8.x + nVar1.x;
        fVar11 = nVar1.y;
        local_88 = CONCAT44(local_d8.y + fVar11,fVar10);
        uStack_80 = 0;
        content.w = local_d8.h - (fVar11 + fVar11);
        local_78 = ZEXT416((uint)content.w);
        content.y = local_d8.y + fVar11;
        content.x = fVar10;
        content.h = content.w;
        nk_draw_symbol(out,local_ac,content,local_a8._0_4_,foreground,1.0,(ctx->style).font);
        local_98.padding.x = 0.0;
        local_98.padding.y = 0.0;
        nVar1 = (ctx->style).combo.content_padding;
        fVar10 = nVar1.x;
        fVar11 = nVar1.y;
        b.x = (float)local_78._0_4_ + (float)local_88 + (ctx->style).combo.spacing.x + fVar10;
        b.y = local_d8.y + fVar11;
        b.w = ((float)local_c8._0_4_ - fVar10) - b.x;
        b.h = local_d8.h - (fVar11 + fVar11);
        nk_widget_text(out,b,selected,len,&local_98,0x11,(ctx->style).font);
        header_00.y = local_d8.y;
        header_00.x = local_d8.x;
        header_00.w = local_d8.w;
        header_00.h = local_d8.h;
        iVar7 = nk_combo_begin(ctx,win,(nk_vec2)local_68._0_8_,is_clicked,header_00);
      }
      return iVar7;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5a26,
                  "int nk_combo_begin_symbol_text(struct nk_context *, const char *, int, enum nk_symbol_type, struct nk_vec2)"
                 );
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x5a25,
                "int nk_combo_begin_symbol_text(struct nk_context *, const char *, int, enum nk_symbol_type, struct nk_vec2)"
               );
}

Assistant:

NK_API int
nk_combo_begin_symbol_text(struct nk_context *ctx, const char *selected, int len,
    enum nk_symbol_type symbol, struct nk_vec2 size)
{
    struct nk_window *win;
    struct nk_style *style;
    struct nk_input *in;

    struct nk_rect header;
    int is_clicked = nk_false;
    enum nk_widget_layout_states s;
    const struct nk_style_item *background;
    struct nk_color symbol_color;
    struct nk_text text;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    style = &ctx->style;
    s = nk_widget(&header, ctx);
    if (!s) return 0;

    in = (win->layout->flags & NK_WINDOW_ROM || s == NK_WIDGET_ROM)? 0: &ctx->input;
    if (nk_button_behavior(&ctx->last_widget_state, header, in, NK_BUTTON_DEFAULT))
        is_clicked = nk_true;

    /* draw combo box header background and border */
    if (ctx->last_widget_state & NK_WIDGET_STATE_ACTIVED) {
        background = &style->combo.active;
        symbol_color = style->combo.symbol_active;
        text.text = style->combo.label_active;
    } else if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER) {
        background = &style->combo.hover;
        symbol_color = style->combo.symbol_hover;
        text.text = style->combo.label_hover;
    } else {
        background = &style->combo.normal;
        symbol_color = style->combo.symbol_normal;
        text.text = style->combo.label_normal;
    }
    if (background->type == NK_STYLE_ITEM_IMAGE) {
        text.background = nk_rgba(0,0,0,0);
        nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
    } else {
        text.background = background->data.color;
        nk_fill_rect(&win->buffer, header, style->combo.rounding, background->data.color);
        nk_stroke_rect(&win->buffer, header, style->combo.rounding, style->combo.border, style->combo.border_color);
    }
    {
        struct nk_rect content;
        struct nk_rect button;
        struct nk_rect label;
        struct nk_rect image;

        enum nk_symbol_type sym;
        if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
            sym = style->combo.sym_hover;
        else if (is_clicked)
            sym = style->combo.sym_active;
        else sym = style->combo.sym_normal;

        /* calculate button */
        button.w = header.h - 2 * style->combo.button_padding.y;
        button.x = (header.x + header.w - header.h) - style->combo.button_padding.x;
        button.y = header.y + style->combo.button_padding.y;
        button.h = button.w;

        content.x = button.x + style->combo.button.padding.x;
        content.y = button.y + style->combo.button.padding.y;
        content.w = button.w - 2 * style->combo.button.padding.x;
        content.h = button.h - 2 * style->combo.button.padding.y;
        nk_draw_button_symbol(&win->buffer, &button, &content, ctx->last_widget_state,
            &ctx->style.combo.button, sym, style->font);

        /* draw symbol */
        image.x = header.x + style->combo.content_padding.x;
        image.y = header.y + style->combo.content_padding.y;
        image.h = header.h - 2 * style->combo.content_padding.y;
        image.w = image.h;
        nk_draw_symbol(&win->buffer, symbol, image, text.background, symbol_color,
            1.0f, style->font);

        /* draw label */
        text.padding = nk_vec2(0,0);
        label.x = image.x + image.w + style->combo.spacing.x + style->combo.content_padding.x;
        label.y = header.y + style->combo.content_padding.y;
        label.w = (button.x - style->combo.content_padding.x) - label.x;
        label.h = header.h - 2 * style->combo.content_padding.y;
        nk_widget_text(&win->buffer, label, selected, len, &text, NK_TEXT_LEFT, style->font);
    }
    return nk_combo_begin(ctx, win, size, is_clicked, header);
}